

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrixFunction.cpp
# Opt level: O1

void getR(int itAtom,double *a,double theta,double (*R) [4])

{
  int i;
  ulong *puVar1;
  double *pdVar2;
  int j;
  int iVar3;
  long lVar4;
  long lVar5;
  int j_3;
  long lVar6;
  double (*Q_00) [4];
  double dVar7;
  ulong uVar8;
  double v [3];
  double tmp [4] [4];
  double transposeT [4] [4];
  double T [4] [4];
  double Q [4] [4];
  double local_238 [4];
  double local_218 [16];
  ulong local_198 [16];
  ulong local_118 [16];
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar3 = itAtom * 3 + -3;
  lVar4 = 0;
  do {
    local_238[lVar4] = a[(itAtom * 3 + -6) + lVar4] - a[iVar3 + lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  dVar7 = 0.0;
  lVar4 = 0;
  do {
    dVar7 = dVar7 + local_238[lVar4] * local_238[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  lVar4 = 0;
  do {
    local_238[lVar4] = local_238[lVar4] / dVar7;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  Q_00 = (double (*) [4])&local_98;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  getQ(Q_00,local_238,theta);
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      if (lVar4 == 3 || lVar5 == 3) {
        (*Q_00)[lVar5] = 0.0;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    lVar4 = lVar4 + 1;
    Q_00 = Q_00 + 1;
  } while (lVar4 != 4);
  uStack_20 = 0x3ff0000000000000;
  puVar1 = local_118;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uVar8 = 0x3ff0000000000000;
      if (lVar4 != lVar5) {
        uVar8 = 0;
      }
      puVar1[lVar5] = uVar8;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    lVar4 = lVar4 + 1;
    puVar1 = puVar1 + 4;
  } while (lVar4 != 4);
  puVar1 = local_198;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uVar8 = 0x3ff0000000000000;
      if (lVar4 != lVar5) {
        uVar8 = 0;
      }
      puVar1[lVar5] = uVar8;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    lVar4 = lVar4 + 1;
    puVar1 = puVar1 + 4;
  } while (lVar4 != 4);
  lVar4 = 6;
  do {
    uVar8 = *(ulong *)((long)a + lVar4 + (long)iVar3 * 8 + -6);
    *(ulong *)((long)local_118 + lVar4 * 4) = uVar8;
    *(ulong *)((long)local_198 + lVar4 * 4) = uVar8 ^ 0x8000000000000000;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x1e);
  local_218[0xe] = 0.0;
  local_218[0xf] = 0.0;
  local_218[0xc] = 0.0;
  local_218[0xd] = 0.0;
  local_218[10] = 0.0;
  local_218[0xb] = 0.0;
  local_218[8] = 0.0;
  local_218[9] = 0.0;
  local_218[6] = 0.0;
  local_218[7] = 0.0;
  local_218[4] = 0.0;
  local_218[5] = 0.0;
  local_218[2] = 0.0;
  local_218[3] = 0.0;
  local_218[0] = 0.0;
  local_218[1] = 0.0;
  puVar1 = local_118;
  lVar4 = 0;
  do {
    lVar5 = 0;
    pdVar2 = &local_98;
    do {
      dVar7 = local_218[lVar4 * 4 + lVar5];
      lVar6 = 0;
      do {
        dVar7 = dVar7 + *(double *)((long)puVar1 + lVar6) * *(double *)((long)pdVar2 + lVar6 * 4);
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x20);
      local_218[lVar4 * 4 + lVar5] = dVar7;
      lVar5 = lVar5 + 1;
      pdVar2 = pdVar2 + 1;
    } while (lVar5 != 4);
    lVar4 = lVar4 + 1;
    puVar1 = puVar1 + 4;
  } while (lVar4 != 4);
  R[3][2] = 0.0;
  R[3][3] = 0.0;
  R[3][0] = 0.0;
  R[3][1] = 0.0;
  R[2][2] = 0.0;
  R[2][3] = 0.0;
  R[2][0] = 0.0;
  R[2][1] = 0.0;
  R[1][2] = 0.0;
  R[1][3] = 0.0;
  R[1][0] = 0.0;
  R[1][1] = 0.0;
  (*R)[2] = 0.0;
  (*R)[3] = 0.0;
  (*R)[0] = 0.0;
  (*R)[1] = 0.0;
  pdVar2 = local_218;
  lVar4 = 0;
  do {
    lVar5 = 0;
    puVar1 = local_198;
    do {
      dVar7 = R[lVar4][lVar5];
      lVar6 = 0;
      do {
        dVar7 = dVar7 + *(double *)((long)pdVar2 + lVar6) * *(double *)((long)puVar1 + lVar6 * 4);
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x20);
      R[lVar4][lVar5] = dVar7;
      lVar5 = lVar5 + 1;
      puVar1 = puVar1 + 1;
    } while (lVar5 != 4);
    lVar4 = lVar4 + 1;
    pdVar2 = pdVar2 + 4;
  } while (lVar4 != 4);
  return;
}

Assistant:

void getR(int itAtom, double * a, double theta, double R[4][4]){
    double v[3];
    int ii=(itAtom-2) *3, jj=(itAtom-1) *3;       // i: the x index of (itAtom-2)
    for (int k=0; k<3; k++)
        v[k] = a[ii+k] - a[jj+k];                             // v = Q(i-1) - Qi
    unitization(v);                                         // v[0]^2 + v[1]^2 + v[2]^2 = 1
    double Q[4][4];
    initialize_0(Q);
    getQ(Q, v, theta);          //set Q[3][3]
    for (int i=0; i<4; i++)
        for (int j=0; j<4; j++)
            if (i==3 || j==3)
                Q[i][j] = 0;
    Q[3][3] = 1;

    double T[4][4], transposeT[4][4];
    initialize_1(T);
    initialize_1(transposeT);
    jj=(itAtom-1) *3;
    for (int p=0; p<3; p++){
        T[p][3] = a[jj+p];
        transposeT[p][3] = -a[jj+p];
    }
    double tmp[4][4];
    matrixProduct(T, Q, tmp);
    matrixProduct(tmp, transposeT, R);
}